

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Radio_Communications_Header.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Radio_Communications_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Radio_Communications_Header *this)

{
  ostream *poVar1;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Radio_Communications_Header *local_18;
  Radio_Communications_Header *this_local;
  
  local_18 = this;
  this_local = (Radio_Communications_Header *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_EntityID);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"Radio ID:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16RadioID);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Radio_Communications_Header::GetAsString() const
{
    KStringStream ss;

    ss << "Entity ID:\n"
       << IndentString( m_EntityID.GetAsString(), 1 )
       << "Radio ID:        " << m_ui16RadioID << "\n";

    return ss.str();
}